

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O2

StringRef * Potassco::operator<<(StringRef *str,uchar *val)

{
  string *out;
  
  out = str->out;
  if (out->_M_string_length != 0) {
    std::__cxx11::string::append((ulong)out,'\x01');
    out = str->out;
  }
  xconvert(out,(uint)*val);
  return str;
}

Assistant:

inline StringRef& operator<<(StringRef& str, const T& val) {
	if (!str.out->empty()) { str.out->append(1, ','); }
	xconvert(*str.out, val);
	return str;
}